

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::binary_op_div>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  
  uVar7 = a->h * a->w * a->d;
  pvVar12 = a->data;
  sVar1 = a->cstep;
  pvVar13 = b->data;
  sVar2 = b->cstep;
  sVar3 = c->cstep;
  sVar4 = c->elemsize;
  uVar14 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar14;
  }
  pvVar10 = c->data;
  uVar9 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar9 = uVar14;
  }
  sVar5 = b->elemsize;
  sVar6 = a->elemsize;
  for (; uVar14 != uVar9; uVar14 = uVar14 + 1) {
    for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      *(float *)((long)pvVar10 + uVar11 * 4) =
           *(float *)((long)pvVar12 + uVar11 * 4) / *(float *)((long)pvVar13 + uVar11 * 4);
    }
    pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar4);
    pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar5);
    pvVar12 = (void *)((long)pvVar12 + sVar1 * sVar6);
  }
  return (int)uVar8;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int channels = a.c;
    int size = a.w * a.h * a.d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], ptr1[i]);
        }
    }

    return 0;
}